

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<unsigned_long>::internalSetData<std::pair<int,int>>
          (Parameter<unsigned_long> *this,pair<int,_int> data)

{
  bool bVar1;
  pair<int,_int> in_RSI;
  long in_RDI;
  bool result;
  unsigned_long tmp;
  RepType_conflict1 local_18 [3];
  
  local_18[0] = 0;
  bVar1 = ParameterTraits<unsigned_long>::convert<std::pair<int,int>>(in_RSI,local_18);
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    *(RepType_conflict1 *)(in_RDI + 0x30) = local_18[0];
  }
  return bVar1;
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }